

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_version(void)

{
  char local_38 [8];
  char cfitsioversion [40];
  float version;
  
  fp_msg("1.7.0 (Dec 2013)");
  ffvers(cfitsioversion + 0x24);
  snprintf(local_38,0x28," CFITSIO version %5.3f",(double)(float)cfitsioversion._36_4_);
  fp_msg(local_38);
  fp_msg("\n");
  return 0;
}

Assistant:

int fp_version (void)
{
        float version;
        char cfitsioversion[40];

        fp_msg (FPACK_VERSION);
        fits_get_version(&version);
        snprintf(cfitsioversion, 40," CFITSIO version %5.3f", version);
        fp_msg(cfitsioversion);
        fp_msg ("\n");
        return(0);
}